

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<float,_3> * __thiscall
TPZManVector<float,_3>::operator=(TPZManVector<float,_3> *this,TPZManVector<float,_3> *copy)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this == copy) {
    return this;
  }
  uVar5 = (copy->super_TPZVec<float>).fNElements;
  lVar2 = (this->super_TPZVec<float>).fNAlloc;
  if ((lVar2 < (long)uVar5) &&
     (pfVar3 = (this->super_TPZVec<float>).fStore,
     pfVar3 != this->fExtAlloc && pfVar3 != (float *)0x0)) {
    operator_delete__(pfVar3);
    (this->super_TPZVec<float>).fStore = (float *)0x0;
    (this->super_TPZVec<float>).fNAlloc = 0;
    lVar2 = 0;
  }
  if ((long)uVar5 < 4) {
    pfVar1 = (this->super_TPZVec<float>).fStore;
    pfVar3 = this->fExtAlloc;
    if (pfVar1 != (float *)0x0 && pfVar1 != pfVar3) {
      operator_delete__(pfVar1);
    }
    (this->super_TPZVec<float>).fNAlloc = 0;
    (this->super_TPZVec<float>).fStore = pfVar3;
  }
  else {
    if ((long)uVar5 <= lVar2) {
      (this->super_TPZVec<float>).fNElements = uVar5;
      pfVar3 = (this->super_TPZVec<float>).fStore;
      goto LAB_00c25de4;
    }
    pfVar3 = (float *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | uVar5 * 4);
    (this->super_TPZVec<float>).fStore = pfVar3;
    (this->super_TPZVec<float>).fNAlloc = uVar5;
  }
  (this->super_TPZVec<float>).fNElements = uVar5;
LAB_00c25de4:
  pfVar1 = (copy->super_TPZVec<float>).fStore;
  uVar4 = 0;
  if ((long)uVar5 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pfVar3[uVar4] = pfVar1[uVar4];
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}